

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcsdump.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint64_t uVar1;
  int iVar2;
  int iVar3;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> __s;
  runtime_error *prVar4;
  ostream *poVar5;
  ulong __n;
  int *in_R9;
  int iVar6;
  size_type sVar7;
  __array buf;
  undefined1 local_1c0 [40];
  PrimaryHeader ph;
  Header h;
  string local_148;
  FileHeader fh;
  File file;
  
  sVar7 = (size_type)_optind;
  local_1c0._24_8_ = SEXT48(argc);
  local_1c0._8_8_ = argv;
  while( true ) {
    if ((long)local_1c0._24_8_ <= (long)sVar7) {
      return 0;
    }
    std::__cxx11::string::string
              ((string *)&fh,*(char **)(local_1c0._8_8_ + sVar7 * 8),(allocator *)&h);
    lrit::File::File(&file,&fh.name);
    std::__cxx11::string::~string((string *)&fh);
    lrit::File::getHeader<lrit::PrimaryHeader>(&ph,&file);
    uVar1 = ph.dataLength;
    local_1c0._16_8_ = sVar7;
    if (ph.fileType != 0x82) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar5 = std::operator<<(poVar5,*(char **)(local_1c0._8_8_ + local_1c0._16_8_ * 8));
      poVar5 = std::operator<<(poVar5," has file type ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(uint)ph.fileType);
      poVar5 = std::operator<<(poVar5," (expected: 130)");
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(1);
    }
    lrit::File::getData((File *)local_1c0);
    iVar6 = (int)(uVar1 + 7 >> 3);
    __n = (ulong)iVar6;
    __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(__n);
    memset((void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
    buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    std::istream::read((char *)local_1c0._0_8_,
                       (long)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl);
    if ((*(byte *)(local_1c0._0_8_ + *(long *)(*(long *)local_1c0._0_8_ + -0x18) + 0x20) & 5) != 0)
    {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      h.address._0_4_ = 0x1e;
      util::str<char[28],char[89],char[2],int>
                (&fh.name,(util *)"Assertion `*ifs` failed at ",
                 (char (*) [28])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcsdump.cc"
                 ,(char (*) [89])":",(char (*) [2])&h,in_R9);
      std::runtime_error::runtime_error(prVar4,(string *)&fh);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fh.name._M_dataplus._M_p = (pointer)&fh.name.field_2;
    fh.name._M_string_length = 0;
    fh.name.field_2._M_local_buf[0] = '\0';
    fh.misc1._M_dataplus._M_p = (pointer)&fh.misc1.field_2;
    fh.misc1._M_string_length = 0;
    fh.misc1.field_2._M_local_buf[0] = '\0';
    fh.misc2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fh.misc2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fh.misc2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = dcs::FileHeader::readFrom
                      (&fh,(char *)buf._M_t.
                                   super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl,__n);
    if (iVar2 < 1) break;
    while( true ) {
      iVar3 = iVar6 - iVar2;
      if (iVar3 == 0 || iVar6 < iVar2) break;
      iVar3 = dcs::Header::readFrom
                        (&h,(char *)((long)iVar2 +
                                    (long)buf._M_t.
                                          super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                          .super__Head_base<0UL,_char_*,_false>._M_head_impl),
                         (long)iVar3);
      if (iVar3 < 1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1c0._36_4_ = 0x2b;
        util::str<char[30],char[89],char[2],int>
                  (&local_148,(util *)"Assertion `rv > 0` failed at ",
                   (char (*) [30])
                   "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcsdump.cc"
                   ,(char (*) [89])":",(char (*) [2])(local_1c0 + 0x24),in_R9);
        std::runtime_error::runtime_error(prVar4,(string *)&local_148);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar2 = iVar2 + iVar3 + h.dataLength + 0x21;
    }
    if (iVar3 != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_148._M_dataplus._M_p._0_4_ = 0x38;
      util::str<char[39],char[89],char[2],int>
                ((string *)&h,(util *)"Assertion `nread == nbytes` failed at ",
                 (char (*) [39])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcsdump.cc"
                 ,(char (*) [89])":",(char (*) [2])&local_148,in_R9);
      std::runtime_error::runtime_error(prVar4,(string *)&h);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    dcs::FileHeader::~FileHeader(&fh);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buf);
    if ((long *)local_1c0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1c0._0_8_ + 8))();
    }
    lrit::File::~File(&file);
    sVar7 = local_1c0._16_8_ + 1;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_148._M_dataplus._M_p._0_4_ = 0x24;
  util::str<char[30],char[89],char[2],int>
            ((string *)&h,(util *)"Assertion `rv > 0` failed at ",
             (char (*) [30])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcsdump.cc"
             ,(char (*) [89])":",(char (*) [2])&local_148,in_R9);
  std::runtime_error::runtime_error(prVar4,(string *)&h);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv) {
  int rv;
  int nread;

  for (int i = optind; i < argc; i++) {
    auto file = lrit::File(argv[i]);
    auto ph = file.getHeader<lrit::PrimaryHeader>();
    if (ph.fileType != 130) {
      std::cerr
        << "File " << argv[i]
        << " has file type " << int(ph.fileType)
        << " (expected: 130)"
        << std::endl;
      exit(1);
    }

    // Read DCS data
    int nbytes = (ph.dataLength + 7) / 8;
    auto ifs = file.getData();
    auto buf = std::make_unique<char[]>(nbytes);
    ifs->read(buf.get(), nbytes);
    ASSERT(*ifs);
    nread = 0;

    // Read DCS file header (container for multiple DCS payloads)
    dcs::FileHeader fh;
    rv = fh.readFrom(buf.get(), nbytes);
    ASSERT(rv > 0);
    nread += rv;

    while (nread < nbytes) {
      // Read DCS header
      dcs::Header h;
      rv = h.readFrom(buf.get() + nread, nbytes - nread);
      ASSERT(rv > 0);
      nread += rv;

      // Skip over actual data
      nread += h.dataLength;

      // Skip 14 characters for time with milliseconds (in DCS format).
      // Skip 1 whitepace.
      // Skip 14 characters for time with milliseconds (in DCS format).
      // Skip 4 bytes (same prelude as prelude to first header)
      nread += 14 + 1 + 14 + 4;
    }

    ASSERT(nread == nbytes);
  }

  return 0;
}